

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mime.c
# Opt level: O0

void cleanup_part_content(curl_mimepart *part)

{
  curl_mimepart *part_local;
  
  if (part->freefunc != (curl_free_callback)0x0) {
    (*part->freefunc)(part->arg);
  }
  part->readfunc = (curl_read_callback)0x0;
  part->seekfunc = (curl_seek_callback)0x0;
  part->freefunc = (curl_free_callback)0x0;
  part->arg = part;
  part->data = (char *)0x0;
  part->fp = (FILE *)0x0;
  part->datasize = 0;
  cleanup_encoder_state(&part->encstate);
  part->kind = MIMEKIND_NONE;
  return;
}

Assistant:

static void cleanup_part_content(curl_mimepart *part)
{
  if(part->freefunc)
    part->freefunc(part->arg);

  part->readfunc = NULL;
  part->seekfunc = NULL;
  part->freefunc = NULL;
  part->arg = (void *) part;          /* Defaults to part itself. */
  part->data = NULL;
  part->fp = NULL;
  part->datasize = (curl_off_t) 0;    /* No size yet. */
  cleanup_encoder_state(&part->encstate);
  part->kind = MIMEKIND_NONE;
}